

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

size_t left_idx(size_t idx)

{
  size_t idx_local;
  
  if (idx < 0x8000000000000000) {
    return idx * 2 + 1;
  }
  __assert_fail("idx <= PTRDIFF_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                ,0x16a,"size_t left_idx(size_t)");
}

Assistant:

static size_t left_idx(size_t idx) {
  // The largest possible index is |PTRDIFF_MAX|, not |SIZE_MAX|. If
  // |ptrdiff_t|, a signed type, is the same size as |size_t|, this cannot
  // overflow.
  assert(idx <= PTRDIFF_MAX);
  static_assert(PTRDIFF_MAX <= (SIZE_MAX - 1) / 2, "2 * idx + 1 may oveflow");
  return 2 * idx + 1;
}